

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O3

void __thiscall iqxmlrpc::http::Header::parse(Header *this,string *s)

{
  Header *pHVar1;
  pointer pcVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>
  _Var3;
  mapped_type *pmVar4;
  Malformed_packet *this_00;
  ulong uVar5;
  long lVar6;
  _Elt_pointer pbVar7;
  pointer pcVar8;
  const_iterator i;
  pointer pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pcVar11;
  pointer pcVar12;
  bool bVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>_>
  pVar14;
  string opt_name;
  string opt_value;
  Tokens lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  locale local_100;
  _Map_pointer local_f8;
  _Elt_pointer local_f0;
  _Elt_pointer local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Options *local_c0;
  Validators *local_b8;
  Header *local_b0;
  pointer local_a8;
  anon_union_16_2_ba345be5_for_m_Storage local_a0;
  ulong local_90;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  local_130._M_dataplus._M_p = "\r\n";
  local_130._M_string_length = (long)&names::crlf + 2;
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_a0,(iterator_range<const_char_*> *)&local_130);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88,s,(is_any_ofF<char> *)&local_a0,token_compress_on);
  if ((0x10 < local_90) && (local_a0.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_a0.m_dynSet);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::_M_assign((string *)&this->head_line_);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_f0 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
    local_f8 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
    local_b8 = &this->validators_;
    local_c0 = &this->options_;
    pbVar7 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_b0 = this;
    do {
      paVar10 = &local_130.field_2;
      pcVar11 = (pointer)pbVar7->_M_string_length;
      if (pcVar11 == (pointer)0x0) {
LAB_0014f438:
        this_00 = (Malformed_packet *)__cxa_allocate_exception(0x18);
        local_130._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"option line does not contain a colon symbol","");
        Malformed_packet::Malformed_packet(this_00,&local_130);
        __cxa_throw(this_00,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar8 = (pbVar7->_M_dataplus)._M_p;
      pcVar2 = pcVar8 + 1;
      lVar6 = -(long)pcVar8;
      pcVar9 = pcVar2;
      pcVar12 = (pointer)0x1;
      while (pcVar9[-1] != ':') {
        pcVar9 = pcVar9 + 1;
        lVar6 = lVar6 + -1;
        pcVar2 = pcVar2 + 1;
        bVar13 = pcVar12 == pcVar11;
        pcVar12 = pcVar12 + 1;
        if (bVar13) goto LAB_0014f438;
      }
      if ((long)pcVar12 - (long)pcVar11 == 1) goto LAB_0014f438;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      pcVar11 = (pbVar7->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar10;
      local_e8 = pbVar7;
      if ((pointer)-lVar6 != pcVar11 && -1 < -(long)pcVar11 + -lVar6) {
        uVar5 = -(long)pcVar11 + (long)pcVar2;
        local_a8 = pcVar8;
        do {
          std::__cxx11::string::push_back((char)&local_130);
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
        pcVar11 = (local_e8->_M_dataplus)._M_p;
        pcVar8 = local_a8;
      }
      pHVar1 = local_b0;
      if (pcVar11 + (local_e8->_M_string_length - (long)pcVar8) != pcVar12 &&
          -1 < (long)(pcVar11 + (local_e8->_M_string_length - (long)pcVar8)) - (long)pcVar12) {
        pcVar11 = pcVar11 + lVar6 + local_e8->_M_string_length;
        do {
          std::__cxx11::string::push_back((char)&local_e0);
          pcVar11 = pcVar11 + -1;
        } while ((pointer)0x1 < pcVar11);
      }
      std::locale::locale((locale *)local_110);
      local_108._0_2_ = 0x2000;
      std::locale::locale(&local_100,(locale *)local_110);
      boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                (&local_130,(is_classifiedF *)&local_108);
      std::locale::~locale(&local_100);
      std::locale::~locale((locale *)local_110);
      std::locale::locale((locale *)local_110);
      local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT62(local_108._2_6_,0x2000);
      std::locale::locale(&local_100,(locale *)local_110);
      boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                (&local_e0,(is_classifiedF *)&local_108);
      std::locale::~locale(&local_100);
      std::locale::~locale((locale *)local_110);
      std::locale::locale((locale *)local_110);
      local_100._M_impl = (_Impl *)(local_130._M_dataplus._M_p + local_130._M_string_length);
      local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p;
      boost::algorithm::detail::
      transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_lowerF<char>>
                ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_108,(locale *)local_110);
      std::locale::~locale((locale *)local_110);
      pVar14 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>_>
               ::equal_range(&local_b8->_M_t,&local_130);
      for (_Var3 = pVar14.first._M_node; _Var3._M_node != pVar14.second._M_node._M_node;
          _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node)) {
        if ((int)_Var3._M_node[2]._M_color <= (int)pHVar1->ver_level_) {
          boost::
          function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::operator()((function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&_Var3._M_node[2]._M_parent,&local_e0);
        }
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_c0,&local_130);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      pbVar7 = local_e8 + 1;
      if (pbVar7 == local_f0) {
        pbVar7 = local_f8[1];
        local_f8 = local_f8 + 1;
        local_f0 = pbVar7 + 0x10;
      }
    } while (pbVar7 != local_88._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void Header::parse(const std::string& s)
{
  typedef std::deque<std::string> Tokens;
  Tokens lines;
  boost::split(lines, s, boost::is_any_of(names::crlf), boost::token_compress_on);

  if (!lines.empty()) {
    head_line_ = lines.front();
    lines.pop_front();
  }

  for (Tokens::iterator i = lines.begin(); i != lines.end(); ++i) {
    boost::iterator_range<std::string::iterator> j = boost::find_first(*i, ":");
    if (j.begin() == i->end())
      throw Malformed_packet("option line does not contain a colon symbol");

    std::string opt_name, opt_value;
    std::copy(i->begin(), j.begin(), std::back_inserter(opt_name));
    std::copy(j.end(), i->end(), std::back_inserter(opt_value));

    boost::trim(opt_name);
    boost::trim(opt_value);
    boost::to_lower(opt_name);
    set_option_checked(opt_name, opt_value);
  }
}